

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O1

bool __thiscall spvtools::opt::IRContext::RemoveExtension(IRContext *this,Extension extension)

{
  Module *pMVar1;
  FeatureManager *this_00;
  bool bVar2;
  char *__s;
  string_view extensionName;
  inst_iterator local_68;
  inst_iterator local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  size_t local_30;
  char *local_28;
  
  __s = ExtensionToString(extension);
  local_30 = strlen(__s);
  local_58._M_unused._M_object = &local_30;
  pMVar1 = (this->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  local_60.super_iterator.node_ =
       *(iterator *)
        ((long)&(pMVar1->extensions_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  local_68.super_iterator.node_ =
       (iterator)((long)&(pMVar1->extensions_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_context.cpp:298:7)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_context.cpp:298:7)>
             ::_M_manager;
  local_28 = __s;
  bVar2 = KillInstructionIf(this,&local_60,&local_68,
                            (function<bool_(spvtools::opt::Instruction_*)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if ((bVar2) &&
     (this_00 = (this->feature_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl,
     this_00 != (FeatureManager *)0x0)) {
    FeatureManager::RemoveExtension(this_00,extension);
  }
  return bVar2;
}

Assistant:

bool IRContext::RemoveExtension(Extension extension) {
  const std::string_view extensionName = ExtensionToString(extension);
  const bool removed = KillInstructionIf(
      module()->extension_begin(), module()->extension_end(),
      [&extensionName](Instruction* inst) {
        return inst->GetOperand(0).AsString() == extensionName;
      });

  if (removed && feature_mgr_ != nullptr) {
    feature_mgr_->RemoveExtension(extension);
  }

  return removed;
}